

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O1

SquareMatrix<double> __thiscall qclab::qgates::RotationY<double>::matrix(RotationY<double> *this)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  data_type extraout_RDX;
  long in_RSI;
  SquareMatrix<double> SVar4;
  
  uVar1 = *(undefined8 *)(in_RSI + 0x10);
  uVar2 = *(ulong *)(in_RSI + 0x18);
  (this->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)0x2;
  puVar3 = (undefined8 *)operator_new__(0x20);
  *(undefined8 **)&(this->super_QRotationGate1<double>).super_QGate1<double>.qubit_ = puVar3;
  *puVar3 = uVar1;
  puVar3[1] = uVar2;
  puVar3[2] = uVar2 ^ 0x8000000000000000;
  puVar3[3] = uVar1;
  SVar4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       extraout_RDX._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  SVar4.size_ = (size_type_conflict)this;
  return SVar4;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( this->cos() , -this->sin() ,
                                                  this->sin() ,  this->cos() ) ;
        }